

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedback::DrawXFBStreamInstanced::iterate(DrawXFBStreamInstanced *this)

{
  RenderContext *pRVar1;
  ContextInfo *pCVar2;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  bool local_4d9;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1d0;
  byte local_39;
  bool local_38;
  undefined1 local_37;
  byte local_36;
  byte local_35;
  ApiType AStack_34;
  bool test_error;
  bool is_ok;
  bool is_arb_gpu_shader5;
  bool is_arb_ubo;
  bool is_arb_tf_instanced;
  byte local_29;
  deUint32 local_28;
  ApiType AStack_24;
  bool is_at_least_gl_42;
  byte local_1d;
  deUint32 local_1c;
  ApiType AStack_18;
  bool is_at_least_gl_40;
  byte local_11;
  DrawXFBStreamInstanced *pDStack_10;
  bool is_at_least_gl_31;
  DrawXFBStreamInstanced *this_local;
  
  pDStack_10 = this;
  pRVar1 = deqp::Context::getRenderContext(this->m_context);
  AStack_18.m_bits = (*pRVar1->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::core(3,1);
  local_11 = glu::contextSupports((ContextType)AStack_18.m_bits,(ApiType)local_1c);
  pRVar1 = deqp::Context::getRenderContext(this->m_context);
  AStack_24.m_bits = (*pRVar1->_vptr_RenderContext[2])();
  local_28 = (deUint32)glu::ApiType::core(4,0);
  local_1d = glu::contextSupports((ContextType)AStack_24.m_bits,(ApiType)local_28);
  pRVar1 = deqp::Context::getRenderContext(this->m_context);
  _is_ok = (*pRVar1->_vptr_RenderContext[2])();
  AStack_34 = glu::ApiType::core(4,2);
  local_29 = glu::contextSupports((ContextType)_is_ok,AStack_34);
  pCVar2 = deqp::Context::getContextInfo(this->m_context);
  local_35 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_ARB_transform_feedback_instanced");
  pCVar2 = deqp::Context::getContextInfo(this->m_context);
  local_36 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_ARB_uniform_buffer_object");
  pCVar2 = deqp::Context::getContextInfo(this->m_context);
  local_37 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_ARB_gpu_shader5");
  local_38 = true;
  local_39 = 0;
  if ((((local_29 & 1) != 0) ||
      (((((local_11 & 1) != 0 || ((local_36 & 1) != 0)) && ((bool)local_37)) &&
       ((local_35 & 1) != 0)))) || (((local_1d & 1) != 0 && ((local_35 & 1) != 0)))) {
    prepareObjects(this);
    drawForXFB(this);
    drawStreamInstanced(this);
    local_4d9 = false;
    if ((local_38 & 1U) != 0) {
      local_4d9 = check(this);
    }
    local_38 = local_4d9;
  }
  clean(this);
  if ((local_38 & 1U) == 0) {
    if ((local_39 & 1) == 0) {
      pTVar3 = deqp::Context::getTestContext(this->m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_4d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_4d0,(char (*) [39])"Draw XFB Stream Instanced have failed.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4d0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      pTVar3 = deqp::Context::getTestContext(this->m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_350,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_350,
                          (char (*) [49])"Draw XFB Stream Instanced have approached error.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_350);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    pTVar3 = deqp::Context::getTestContext(this->m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [39])"Draw XFB Stream Instanced have passed.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFBStreamInstanced::iterate(void)
{
	/* Initializations. */
	bool is_at_least_gl_31   = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 1)));
	bool is_at_least_gl_40   = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_at_least_gl_42   = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 2)));
	bool is_arb_tf_instanced = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback_instanced");
	bool is_arb_ubo			 = m_context.getContextInfo().isExtensionSupported("GL_ARB_uniform_buffer_object");
	bool is_arb_gpu_shader5  = m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader5");

	bool is_ok		= true;
	bool test_error = false;

	/* Test. */
	try
	{
		if (is_at_least_gl_42 || ((is_at_least_gl_31 || is_arb_ubo) && is_arb_gpu_shader5 && is_arb_tf_instanced) ||
			(is_at_least_gl_40 && is_arb_tf_instanced))
		{
			prepareObjects();
			drawForXFB();
			drawStreamInstanced();

			is_ok = is_ok && check();
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean GL objects */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream Instanced have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Draw XFB Stream Instanced have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream Instanced have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}